

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::
     PrintTupleTo<std::tuple<void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>,4ul>
               (long t,ostream *param_2)

{
  PrintTupleTo<std::tuple<void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>,3ul>
            ();
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  std::ostream::operator<<(param_2,*(int *)(t + 0xc));
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}